

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O3

void testDeepScanLineHuge(string *tempDir)

{
  pointer pcVar1;
  string *in_RCX;
  bool random_channel_data;
  bool random_channel_data_00;
  string fn;
  long *local_38 [2];
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n\nTesting the DeepScanLineInput/OutputFile for huge scanlines:\n",0x3f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  random_reseed(1);
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  anon_unknown.dwarf_12b238::readWriteTest(0,(int)local_38,random_channel_data,in_RCX);
  anon_unknown.dwarf_12b238::readWriteTest(1,(int)local_38,random_channel_data_00,in_RCX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void
testDeepScanLineHuge (const std::string& tempDir)
{
    try
    {
        cout
            << "\n\nTesting the DeepScanLineInput/OutputFile for huge scanlines:\n"
            << endl;

        random_reseed (1);
        std::string fn = tempDir + "imf_test_deep_scanline_huge.exr";

        readWriteTest (10, 5, false, fn);
        readWriteTest (10, 5, true, fn);
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}